

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc-twoparty.c++
# Opt level: O2

void __thiscall
capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection
          (AcceptedConnection *this,Client *bootstrapInterface,
          Own<kj::AsyncIoStream> *connectionParam)

{
  AsyncIoStream *pAVar1;
  ReaderOptions receiveOptions;
  Own<capnp::ClientHook> local_28;
  
  pAVar1 = connectionParam->ptr;
  (this->connection).disposer = connectionParam->disposer;
  (this->connection).ptr = pAVar1;
  connectionParam->ptr = (AsyncIoStream *)0x0;
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  TwoPartyVatNetwork::TwoPartyVatNetwork
            (&this->network,(this->connection).ptr,SERVER,receiveOptions);
  local_28.disposer = (bootstrapInterface->hook).disposer;
  local_28.ptr = (bootstrapInterface->hook).ptr;
  (bootstrapInterface->hook).ptr = (ClientHook *)0x0;
  makeRpcServer<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&this->rpcSystem,&(this->network).super_TwoPartyVatNetworkBase,
             (Client *)&local_28);
  kj::Own<capnp::ClientHook>::dispose(&local_28);
  return;
}

Assistant:

explicit AcceptedConnection(Capability::Client bootstrapInterface,
                              kj::Own<kj::AsyncIoStream>&& connectionParam)
      : connection(kj::mv(connectionParam)),
        network(*connection, rpc::twoparty::Side::SERVER),
        rpcSystem(makeRpcServer(network, kj::mv(bootstrapInterface))) {}